

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

ostream * wasm::operator<<(ostream *os,Printed *printed)

{
  ostream *poVar1;
  undefined1 local_c8 [96];
  bool local_68;
  _Any_data local_60;
  _Manager_type local_50;
  _Any_data local_40;
  code *local_30;
  
  std::function<wasm::TypeNames_(wasm::HeapType)>::function
            ((function<wasm::TypeNames_(wasm::HeapType)> *)&local_40,&printed->generateName);
  anon_unknown_0::TypePrinter::TypePrinter
            ((TypePrinter *)local_c8,os,(HeapTypeNameGenerator *)&local_40);
  poVar1 = anon_unknown_0::TypePrinter::print((TypePrinter *)local_c8,(HeapType)printed->typeID);
  if (local_50 != (_Manager_type)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  if (local_68 == true) {
    local_68 = false;
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_c8 + 0x28));
  }
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, HeapType::Printed printed) {
  return TypePrinter(os, printed.generateName).print(HeapType(printed.typeID));
}